

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectoringNozzleSystem.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::VectoringNozzleSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,VectoringNozzleSystem *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Vectoring Nozzle System:");
  poVar1 = std::operator<<(poVar1,"\n\tHorizontal Deflection Angle: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32HDeflAngle);
  poVar1 = std::operator<<(poVar1,"\n\tVertical Deflection Angle:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32VDeflAngle);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString VectoringNozzleSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Vectoring Nozzle System:"
       << "\n\tHorizontal Deflection Angle: " << m_f32HDeflAngle
       << "\n\tVertical Deflection Angle:   " << m_f32VDeflAngle
       << "\n";

    return ss.str();
}